

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonGeometryForLine(PageControlPrivate *this,int line)

{
  reference pQVar1;
  QRect local_3c;
  int local_2c;
  int local_28;
  int i;
  int size;
  int y;
  int offset;
  int index;
  int count;
  int line_local;
  PageControlPrivate *this_local;
  
  offset = this->countInOneLine;
  if (line == this->linesCount + -1) {
    offset = this->countInLastLine;
  }
  y = line * this->countInOneLine;
  size = (this->widgetWidth - offset * this->buttonSize) / 2;
  i = line * this->buttonSize;
  local_28 = this->buttonSize + -1;
  index = line;
  _count = this;
  for (local_2c = 0; local_2c < offset; local_2c = local_2c + 1) {
    QRect::QRect(&local_3c,size + local_2c * this->buttonSize,i,local_28,local_28);
    pQVar1 = QList<QRect>::operator[](&this->rectangles,(long)y);
    pQVar1->x1 = local_3c.x1;
    pQVar1->y1 = local_3c.y1;
    pQVar1->x2 = local_3c.x2;
    pQVar1->y2 = local_3c.y2;
    y = y + 1;
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonGeometryForLine( int line )
{
	int count = countInOneLine;

	if( line == linesCount - 1 )
		count = countInLastLine;

	int index = line * countInOneLine;

	const int offset = ( widgetWidth - count * buttonSize ) / 2;

	const int y = line * buttonSize;

	const int size = buttonSize - 1;

	for( int i = 0; i < count; ++i )
	{
		rectangles[ index ] = QRect( offset + i * buttonSize, y,
			size, size );

		++index;
	}
}